

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall
CLI::OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
          (OptionBase<CLI::OptionDefaults> *this,Option *other)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  
  ::std::__cxx11::string::_M_assign((string *)other);
  (other->super_OptionBase<CLI::Option>).required_ = this->required_;
  Option::ignore_case<CLI::App>(other,this->ignore_case_);
  Option::ignore_underscore<CLI::App>(other,this->ignore_underscore_);
  bVar1 = this->disable_flag_override_;
  cVar2 = this->delimiter_;
  bVar3 = this->always_capture_default_;
  (other->super_OptionBase<CLI::Option>).configurable_ = this->configurable_;
  (other->super_OptionBase<CLI::Option>).disable_flag_override_ = bVar1;
  (other->super_OptionBase<CLI::Option>).delimiter_ = cVar2;
  (other->super_OptionBase<CLI::Option>).always_capture_default_ = bVar3;
  Option::multi_option_policy(other,this->multi_option_policy_);
  return;
}

Assistant:

void copy_to(T *other) const {
        other->group(group_);
        other->required(required_);
        other->ignore_case(ignore_case_);
        other->ignore_underscore(ignore_underscore_);
        other->configurable(configurable_);
        other->disable_flag_override(disable_flag_override_);
        other->delimiter(delimiter_);
        other->always_capture_default(always_capture_default_);
        other->multi_option_policy(multi_option_policy_);
    }